

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.cc
# Opt level: O0

MatrixXd * __thiscall
lf::geometry::Point::JacobianInverseGramian
          (MatrixXd *__return_storage_ptr__,Point *this,MatrixXd *local)

{
  runtime_error *this_00;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  MatrixXd *local_20;
  MatrixXd *local_local;
  Point *this_local;
  
  local_20 = local;
  local_local = (MatrixXd *)this;
  this_local = (Point *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,"JacobianInverseGramian undefined for points.");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"false",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/point.cc"
             ,&local_201);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1d8,&local_200,0x10,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"this code should not be reached");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Eigen::MatrixXd Point::JacobianInverseGramian(
    const Eigen::MatrixXd& local) const {  // NOLINT(misc-unused-parameters)
  LF_VERIFY_MSG(false, "JacobianInverseGramian undefined for points.");
}